

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O0

void anon_unknown.dwarf_101d8b::Chorus_setParami(EffectProps *props,ALenum param,int val)

{
  effect_exception *peVar1;
  int in_EDX;
  uint in_ESI;
  int *in_RDI;
  
  if (in_ESI == 1) {
    if ((in_EDX < 0) || (1 < in_EDX)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Invalid chorus waveform");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    *in_RDI = in_EDX;
  }
  else {
    if (in_ESI != 2) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (peVar1,0xa002,"Invalid chorus integer property 0x%04x",(ulong)in_ESI);
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    if ((in_EDX < -0xb4) || (0xb4 < in_EDX)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Chorus phase out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[1] = in_EDX;
  }
  return;
}

Assistant:

void Chorus_setParami(EffectProps *props, ALenum param, int val)
{
    switch(param)
    {
    case AL_CHORUS_WAVEFORM:
        if(!(val >= AL_CHORUS_MIN_WAVEFORM && val <= AL_CHORUS_MAX_WAVEFORM))
            throw effect_exception{AL_INVALID_VALUE, "Invalid chorus waveform"};
        props->Chorus.Waveform = val;
        break;

    case AL_CHORUS_PHASE:
        if(!(val >= AL_CHORUS_MIN_PHASE && val <= AL_CHORUS_MAX_PHASE))
            throw effect_exception{AL_INVALID_VALUE, "Chorus phase out of range"};
        props->Chorus.Phase = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid chorus integer property 0x%04x", param};
    }
}